

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkfile_p.cpp
# Opt level: O3

void QNetworkFile::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  void *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto switchD_0018c133_default;
      }
    }
    else {
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
    goto switchD_0018c133_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == finished && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == headerRead && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == networkError && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    goto switchD_0018c133_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0018c133_default;
  switch(_id) {
  case 0:
    local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
    iVar4 = 0;
    break;
  case 1:
    local_18 = _a[2];
    local_2c = *_a[1];
    iVar4 = 1;
    break;
  case 2:
    local_18 = _a[2];
    local_2c = *_a[1];
    iVar4 = 2;
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      open((QNetworkFile *)_o,(char *)CONCAT44(in_register_00000034,_c),0x25aa80);
      return;
    }
    goto LAB_0018c2ae;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      (**(code **)(*(long *)_o + 0x70))();
      return;
    }
    goto LAB_0018c2ae;
  default:
    goto switchD_0018c133_default;
  }
  local_20 = &local_2c;
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_28);
switchD_0018c133_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0018c2ae:
  __stack_chk_fail();
}

Assistant:

void QNetworkFile::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkFile *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->headerRead((*reinterpret_cast< std::add_pointer_t<QHttpHeaders::WellKnownHeader>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2]))); break;
        case 2: _t->networkError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->open(); break;
        case 4: _t->close(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(bool )>(_a, &QNetworkFile::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QHttpHeaders::WellKnownHeader , const QByteArray & )>(_a, &QNetworkFile::headerRead, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QNetworkFile::networkError, 2))
            return;
    }
}